

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<VkSurfaceFormatKHR> *
vkb::detail::find_desired_surface_format
          (Result<VkSurfaceFormatKHR> *__return_storage_ptr__,
          vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *available_formats,
          vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *desired_formats)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  VkSurfaceFormatKHR VVar4;
  pointer pVVar5;
  undefined1 uVar6;
  pointer pVVar7;
  bool bVar8;
  bool bVar9;
  
  pVVar5 = (desired_formats->
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (desired_formats->
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  VVar4 = (__return_storage_ptr__->field_0).m_value;
  bVar8 = pVVar5 == pVVar1;
  if (!bVar8) {
    pVVar2 = (available_formats->
             super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = (available_formats->
             super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = __return_storage_ptr__->m_init;
    do {
      if (pVVar2 != pVVar3) {
        pVVar7 = pVVar2;
        bVar9 = pVVar2 == pVVar3;
        do {
          if ((pVVar5->format == pVVar7->format) && (pVVar5->colorSpace == pVVar7->colorSpace)) {
            VVar4 = *pVVar5;
            uVar6 = true;
            if (!bVar9) {
              __return_storage_ptr__->m_init = true;
              (__return_storage_ptr__->field_0).m_value = VVar4;
              if (!bVar8) {
                return __return_storage_ptr__;
              }
              goto LAB_001092d7;
            }
            break;
          }
          pVVar7 = pVVar7 + 1;
          bVar9 = pVVar7 == pVVar3;
        } while (!bVar9);
      }
      pVVar5 = pVVar5 + 1;
      bVar8 = pVVar5 == pVVar1;
    } while (!bVar8);
    __return_storage_ptr__->m_init = (bool)uVar6;
  }
  (__return_storage_ptr__->field_0).m_value = VVar4;
LAB_001092d7:
  (__return_storage_ptr__->field_0).m_value.format = VK_FORMAT_R5G6B5_UNORM_PACK16;
  *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &surface_support_error_category;
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  __return_storage_ptr__->m_init = false;
  return __return_storage_ptr__;
}

Assistant:

Result<VkSurfaceFormatKHR> find_desired_surface_format(
    std::vector<VkSurfaceFormatKHR> const& available_formats, std::vector<VkSurfaceFormatKHR> const& desired_formats) {
    for (auto const& desired_format : desired_formats) {
        for (auto const& available_format : available_formats) {
            // finds the first format that is desired and available
            if (desired_format.format == available_format.format && desired_format.colorSpace == available_format.colorSpace) {
                return desired_format;
            }
        }
    }

    // if no desired format is available, we report that no format is suitable to the user request
    return { make_error_code(SurfaceSupportError::no_suitable_desired_format) };
}